

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bold.cpp
# Opt level: O2

void __thiscall ftxui::Bold::Render(Bold *this,Screen *screen)

{
  Pixel *pPVar1;
  int y;
  int x;
  
  for (y = (this->super_NodeDecorator).super_Node.box_.y_min;
      y <= (this->super_NodeDecorator).super_Node.box_.y_max; y = y + 1) {
    for (x = (this->super_NodeDecorator).super_Node.box_.x_min;
        x <= (this->super_NodeDecorator).super_Node.box_.x_max; x = x + 1) {
      pPVar1 = Screen::PixelAt(screen,x,y);
      pPVar1->field_0x28 = pPVar1->field_0x28 | 2;
    }
  }
  Node::Render((Node *)this,screen);
  return;
}

Assistant:

void Render(Screen& screen) override {
    for (int y = box_.y_min; y <= box_.y_max; ++y) {
      for (int x = box_.x_min; x <= box_.x_max; ++x) {
        screen.PixelAt(x, y).bold = true;
      }
    }
    Node::Render(screen);
  }